

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::on_lsd_peer(session_impl *this,endpoint *peer,sha1_hash *ih)

{
  byte bVar1;
  element_type *peVar2;
  bool bVar3;
  element_type *peVar4;
  weak_ptr<libtorrent::aux::torrent> wVar5;
  shared_ptr<libtorrent::aux::torrent> t;
  undefined1 local_88 [8];
  anon_union_16_3_a3f0114d_for___in6_u local_80;
  lsd_callback local_70;
  undefined1 local_68 [20];
  digest32<256L> local_54;
  
  counters::inc_stats_counter(&this->m_stats_counters,0x3d,1);
  local_68._16_4_ = (ih->m_number)._M_elems[4];
  local_68._0_8_ = *(undefined8 *)(ih->m_number)._M_elems;
  local_68._8_8_ = *(undefined8 *)((ih->m_number)._M_elems + 2);
  digest32<256L>::clear(&local_54);
  wVar5 = find_torrent((session_impl *)local_88,(info_hash_t *)this);
  ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>,
             (session_impl *)local_88,
             wVar5.super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&local_80);
  if (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    peVar4 = ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar1 = (peVar4->m_flags).m_val;
    if ((bVar1 & 2) == 0) {
      if ((bVar1 & 4) != 0) {
        bVar3 = session_settings::get_bool(&this->m_settings,0x8017);
        if (!bVar3) goto LAB_0029627d;
        peVar4 = ((t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                  )->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      bVar3 = digest32<160L>::operator==(ih,&(peVar4->m_info_hash).v1);
      torrent::add_peer(t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,peer,(peer_source_flags_t)0x8,(pex_flags_t)(bVar3 * -0x80 + 0x80));
      peVar2 = t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
        bVar3 = (peer->impl_).data_.base.sa_family != 2;
        if (bVar3) {
          local_80._0_8_ = *(undefined8 *)((long)&(peer->impl_).data_ + 8);
          local_80._8_8_ = *(undefined8 *)((long)&(peer->impl_).data_ + 0x10);
          local_70._vptr_lsd_callback = (_func_int **)(ulong)(peer->impl_).data_.v6.sin6_scope_id;
          local_88._4_4_ = 0;
        }
        else {
          local_88._4_4_ = (peer->impl_).data_.v4.sin_addr.s_addr;
          local_80._0_8_ = (_func_int **)0x0;
          local_80._8_8_ = (_func_int **)0x0;
          local_70._vptr_lsd_callback = (_func_int **)0x0;
        }
        local_88._0_4_ = ZEXT14(bVar3);
        boost::asio::ip::address::to_string_abi_cxx11_((string *)local_68,(address *)local_88);
        (*(peVar2->super_request_callback)._vptr_request_callback[7])
                  (peVar2,"lsd add_peer() [ %s ]",local_68._0_8_);
        ::std::__cxx11::string::~string((string *)local_68);
      }
      torrent::do_connect_boost
                (t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (((this->m_alerts).m_alert_mask._M_i.m_val & 2) != 0) {
        torrent::get_handle((torrent *)local_68);
        alert_manager::
        emplace_alert<libtorrent::lsd_peer_alert,libtorrent::torrent_handle,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&>
                  (&this->m_alerts,(torrent_handle *)local_68,peer);
        ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                  ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
      }
    }
  }
LAB_0029627d:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void session_impl::on_lsd_peer(tcp::endpoint const& peer, sha1_hash const& ih)
	{
		m_stats_counters.inc_stats_counter(counters::on_lsd_peer_counter);
		TORRENT_ASSERT(is_single_thread());

		INVARIANT_CHECK;

		std::shared_ptr<torrent> t = find_torrent(info_hash_t(ih)).lock();
		if (!t) return;
		// don't add peers from lsd to private torrents
		if (t->torrent_file().priv() || (t->torrent_file().is_i2p()
			&& !m_settings.get_bool(settings_pack::allow_i2p_mixed))) return;

		protocol_version const v = ih == t->torrent_file().info_hashes().v1
			? protocol_version::V1 : protocol_version::V2;

		t->add_peer(peer, peer_info::lsd, v == protocol_version::V2 ? pex_lt_v2 : pex_flags_t(0));
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			t->debug_log("lsd add_peer() [ %s ]"
				, peer.address().to_string().c_str());
		}
#endif
		t->do_connect_boost();

		if (m_alerts.should_post<lsd_peer_alert>())
			m_alerts.emplace_alert<lsd_peer_alert>(t->get_handle(), peer);
	}